

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

int nk_chart_begin_colored
              (nk_context *ctx,nk_chart_type type,nk_color color,nk_color highlight,int count,
              float min_value,float max_value)

{
  nk_vec2 nVar1;
  nk_window *pnVar2;
  nk_panel *pnVar3;
  undefined1 auVar4 [16];
  nk_rect r;
  nk_rect rect;
  nk_widget_layout_states nVar5;
  ulong __n;
  nk_chart *__s;
  size_t sVar6;
  size_t __n_00;
  int iVar7;
  nk_command_buffer *b;
  float fVar11;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  float fVar12;
  nk_rect rect_00;
  nk_rect bounds;
  nk_rect local_58;
  nk_color local_48;
  int local_44;
  nk_chart_type local_40;
  nk_color local_3c;
  float local_38;
  float local_34;
  
  local_58.x = 0.0;
  local_58.y = 0.0;
  local_58.w = 0.0;
  local_58.h = 0.0;
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x5d06,
                  "int nk_chart_begin_colored(struct nk_context *, enum nk_chart_type, struct nk_color, struct nk_color, int, float, float)"
                 );
  }
  if (ctx->current != (nk_window *)0x0) {
    local_40 = type;
    local_3c = color;
    local_38 = min_value;
    local_34 = max_value;
    if (ctx->current->layout != (nk_panel *)0x0) {
      nVar5 = nk_widget(&local_58,ctx);
      pnVar2 = ctx->current;
      pnVar3 = pnVar2->layout;
      __s = &pnVar3->chart;
      if (nVar5 == NK_WIDGET_INVALID) {
        sVar6 = (ulong)__s & 3;
        if (sVar6 == 0) {
          sVar6 = 0xb4;
        }
        else {
          __n_00 = -sVar6 + 4;
          memset(__s,0,__n_00);
          memset((void *)((long)__s + __n_00),0,0xb0);
          __s = (nk_chart *)((long)__s + -sVar6 + 0xb4);
        }
        iVar7 = 0;
        memset(__s,0,sVar6);
      }
      else {
        __n = (ulong)__s & 3;
        local_44 = count;
        if (__n == 0) {
          iVar7 = 0;
          memset((pnVar3->chart).slots,0,0xa0);
        }
        else {
          sVar6 = -__n + 4;
          local_48 = highlight;
          memset(__s,0,sVar6);
          memset((void *)((long)__s + sVar6),0,0xb0);
          highlight = local_48;
          memset((void *)((long)__s + -__n + 0xb4),0,__n);
          iVar7 = __s->slot;
        }
        nVar1 = (ctx->style).chart.padding;
        fVar12 = nVar1.x;
        fVar11 = nVar1.y;
        (pnVar3->chart).x = local_58.x + fVar12;
        (pnVar3->chart).y = local_58.y + fVar11;
        auVar8._0_4_ = fVar12 + fVar12;
        auVar8._4_4_ = fVar11 + fVar11;
        auVar8._8_8_ = 0;
        auVar9._4_4_ = local_58.h - auVar8._4_4_;
        auVar9._0_4_ = local_58.w - auVar8._0_4_;
        auVar9._8_8_ = 0;
        auVar9 = maxps(auVar8,auVar9);
        (pnVar3->chart).w = (float)(int)auVar9._0_8_;
        (pnVar3->chart).h = (float)(int)((ulong)auVar9._0_8_ >> 0x20);
        (pnVar3->chart).slot = iVar7 + 1;
        (pnVar3->chart).slots[iVar7].type = local_40;
        (pnVar3->chart).slots[iVar7].count = local_44;
        (pnVar3->chart).slots[iVar7].color = local_3c;
        (pnVar3->chart).slots[iVar7].highlight = highlight;
        fVar12 = local_38;
        if (local_34 <= local_38) {
          fVar12 = local_34;
        }
        (pnVar3->chart).slots[iVar7].min = fVar12;
        fVar11 = local_34;
        if (local_34 <= local_38) {
          fVar11 = local_38;
        }
        (pnVar3->chart).slots[iVar7].max = fVar11;
        (pnVar3->chart).slots[iVar7].range = fVar11 - fVar12;
        b = &pnVar2->buffer;
        if ((ctx->style).chart.background.type == NK_STYLE_ITEM_IMAGE) {
          r.w = local_58.w;
          r.h = local_58.h;
          r.x = local_58.x;
          r.y = local_58.y;
          nk_draw_image(b,r,&(ctx->style).chart.background.data.image,(nk_color)0xffffffff);
        }
        else {
          rect.w = local_58.w;
          rect.h = local_58.h;
          rect.x = local_58.x;
          rect.y = local_58.y;
          nk_fill_rect(b,rect,(ctx->style).chart.rounding,(ctx->style).chart.border_color);
          fVar12 = (ctx->style).chart.border;
          rect_00.x = fVar12 + local_58.x;
          rect_00.y = fVar12 + local_58.y;
          fVar12 = fVar12 + fVar12;
          auVar10._4_4_ = fVar12;
          auVar10._0_4_ = fVar12;
          auVar10._8_4_ = fVar12;
          auVar10._12_4_ = fVar12;
          auVar4._8_8_ = 0;
          auVar4._0_4_ = local_58.w;
          auVar4._4_4_ = local_58.h;
          auVar9 = maxps(auVar10,auVar4);
          rect_00.w = auVar9._0_4_ - fVar12;
          rect_00.h = auVar9._4_4_ - fVar12;
          nk_fill_rect(b,rect_00,(ctx->style).chart.rounding,
                       (ctx->style).chart.background.data.color);
        }
        iVar7 = 1;
      }
      return iVar7;
    }
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x5d08,
                  "int nk_chart_begin_colored(struct nk_context *, enum nk_chart_type, struct nk_color, struct nk_color, int, float, float)"
                 );
  }
  __assert_fail("ctx->current",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                ,0x5d07,
                "int nk_chart_begin_colored(struct nk_context *, enum nk_chart_type, struct nk_color, struct nk_color, int, float, float)"
               );
}

Assistant:

NK_API int
nk_chart_begin_colored(struct nk_context *ctx, enum nk_chart_type type,
    struct nk_color color, struct nk_color highlight,
    int count, float min_value, float max_value)
{
    struct nk_window *win;
    struct nk_chart *chart;
    const struct nk_style *config;
    const struct nk_style_chart *style;

    const struct nk_style_item *background;
    struct nk_rect bounds = {0, 0, 0, 0};

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);

    if (!ctx || !ctx->current || !ctx->current->layout) return 0;
    if (!nk_widget(&bounds, ctx)) {
        chart = &ctx->current->layout->chart;
        nk_zero(chart, sizeof(*chart));
        return 0;
    }

    win = ctx->current;
    config = &ctx->style;
    chart = &win->layout->chart;
    style = &config->chart;

    /* setup basic generic chart  */
    nk_zero(chart, sizeof(*chart));
    chart->x = bounds.x + style->padding.x;
    chart->y = bounds.y + style->padding.y;
    chart->w = bounds.w - 2 * style->padding.x;
    chart->h = bounds.h - 2 * style->padding.y;
    chart->w = NK_MAX(chart->w, 2 * style->padding.x);
    chart->h = NK_MAX(chart->h, 2 * style->padding.y);

    /* add first slot into chart */
    {struct nk_chart_slot *slot = &chart->slots[chart->slot++];
    slot->type = type;
    slot->count = count;
    slot->color = color;
    slot->highlight = highlight;
    slot->min = NK_MIN(min_value, max_value);
    slot->max = NK_MAX(min_value, max_value);
    slot->range = slot->max - slot->min;}

    /* draw chart background */
    background = &style->background;
    if (background->type == NK_STYLE_ITEM_IMAGE) {
        nk_draw_image(&win->buffer, bounds, &background->data.image, nk_white);
    } else {
        nk_fill_rect(&win->buffer, bounds, style->rounding, style->border_color);
        nk_fill_rect(&win->buffer, nk_shrink_rect(bounds, style->border),
            style->rounding, style->background.data.color);
    }
    return 1;
}